

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O2

FSectorPortal * __thiscall sector_t::ValidatePortal(sector_t *this,int which)

{
  FSectorPortal *pFVar1;
  bool bVar2;
  AActor *pAVar3;
  
  pFVar1 = sectorPortals.Array + this->Portals[which];
  if (((sectorPortals.Array[this->Portals[which]].mType != 0) ||
      (pAVar3 = GC::ReadBarrier<AActor>((AActor **)&pFVar1->mSkybox), pAVar3 != (AActor *)0x0)) &&
     (bVar2 = PortalBlocksView(this,which), !bVar2)) {
    if ((pFVar1->mFlags & 1) == 0) {
      return pFVar1;
    }
    if (this->planes[which].Texture.texnum == skyflatnum.texnum) {
      return pFVar1;
    }
  }
  return (FSectorPortal *)0x0;
}

Assistant:

FSectorPortal *sector_t::ValidatePortal(int which)
{
	FSectorPortal *port = GetPortal(which);
	if (port->mType == PORTS_SKYVIEWPOINT && port->mSkybox == nullptr) return nullptr;				// A skybox without a viewpoint is just a regular sky.
	if (PortalBlocksView(which)) return nullptr;													// disabled or obstructed linked portal.
	if ((port->mFlags & PORTSF_SKYFLATONLY) && GetTexture(which) != skyflatnum) return nullptr;		// Skybox without skyflat texture
	return port;
}